

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

void __thiscall leveldb::DBImpl::TEST_CompactRange(DBImpl *this,int level,Slice *begin,Slice *end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  string *psVar3;
  InternalKey end_storage;
  InternalKey begin_storage;
  ParsedInternalKey local_e8;
  ManualCompaction local_c8;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x254,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  if (5 < (uint)level) {
    __assert_fail("level + 1 < config::kNumLevels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x255,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  local_50 = local_40;
  psVar3 = (string *)0x0;
  local_48 = 0;
  local_40[0] = 0;
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  paVar1 = &local_c8.tmp_storage.rep_.field_2;
  local_c8.tmp_storage.rep_._M_string_length = 0;
  local_c8.tmp_storage.rep_.field_2._M_local_buf[0] = '\0';
  local_c8.done = false;
  local_c8.level = level;
  local_c8.tmp_storage.rep_._M_dataplus._M_p = (pointer)paVar1;
  if (begin != (Slice *)0x0) {
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_e8.user_key.data_ = begin->data_;
    local_e8.user_key.size_ = begin->size_;
    local_e8.sequence = 0xffffffffffffff;
    local_e8.type = kTypeValue;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    AppendInternalKey(&local_90,&local_e8);
    psVar3 = (string *)&local_50;
    std::__cxx11::string::operator=(psVar3,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  local_c8.begin = (InternalKey *)psVar3;
  if (end == (Slice *)0x0) {
    psVar3 = (string *)0x0;
  }
  else {
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_e8.user_key.data_ = end->data_;
    local_e8.user_key.size_ = end->size_;
    local_e8.sequence = 0;
    local_e8.type = kTypeDeletion;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    AppendInternalKey(&local_90,&local_e8);
    psVar3 = (string *)&local_70;
    std::__cxx11::string::operator=(psVar3,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  local_c8.end = (InternalKey *)psVar3;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (local_c8.done == false) {
    do {
      if ((((this->shutting_down_)._M_base._M_i & 1U) != 0) ||
         ((this->bg_error_).state_ != (char *)0x0)) break;
      if (this->manual_compaction_ == (ManualCompaction *)0x0) {
        this->manual_compaction_ = &local_c8;
        MaybeScheduleCompaction(this);
      }
      else {
        local_e8.user_key.data_ = (char *)(this->background_work_finished_signal_).mu_;
        local_e8.user_key.size_ = CONCAT71(local_e8.user_key.size_._1_7_,1);
        std::condition_variable::wait((unique_lock *)&this->background_work_finished_signal_);
      }
    } while (local_c8.done != true);
  }
  if (this->manual_compaction_ == &local_c8) {
    this->manual_compaction_ = (ManualCompaction *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.tmp_storage.rep_._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.tmp_storage.rep_._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void DBImpl::TEST_CompactRange(int level, const Slice* begin,
                               const Slice* end) {
  assert(level >= 0);
  assert(level + 1 < config::kNumLevels);

  InternalKey begin_storage, end_storage;

  ManualCompaction manual;
  manual.level = level;
  manual.done = false;
  if (begin == nullptr) {
    manual.begin = nullptr;
  } else {
    begin_storage = InternalKey(*begin, kMaxSequenceNumber, kValueTypeForSeek);
    manual.begin = &begin_storage;
  }
  if (end == nullptr) {
    manual.end = nullptr;
  } else {
    end_storage = InternalKey(*end, 0, static_cast<ValueType>(0));
    manual.end = &end_storage;
  }

  MutexLock l(&mutex_);
  while (!manual.done && !shutting_down_.load(std::memory_order_acquire) &&
         bg_error_.ok()) {
    if (manual_compaction_ == nullptr) {  // Idle
      manual_compaction_ = &manual;
      MaybeScheduleCompaction();
    } else {  // Running either my compaction or another compaction.
      background_work_finished_signal_.Wait();
    }
  }
  if (manual_compaction_ == &manual) {
    // Cancel my manual compaction since we aborted early for some reason.
    manual_compaction_ = nullptr;
  }
}